

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

Image * __thiscall rw::Image::readMasked(Image *this,char *imageName,char *maskName)

{
  int depth;
  Image *this_00;
  size_t __nbytes;
  char *__buf;
  int32 origDepth;
  Image *mask;
  Image *img;
  char *maskName_local;
  char *imageName_local;
  
  __buf = imageName;
  imageName_local = (char *)read((int)this,imageName,(size_t)maskName);
  if ((Image *)imageName_local == (Image *)0x0) {
    imageName_local = (char *)0x0;
  }
  else if (((imageName != (char *)0x0) && (*imageName != '\0')) &&
          (this_00 = (Image *)read((int)imageName,__buf,__nbytes), this_00 != (Image *)0x0)) {
    makeMask(this_00);
    depth = ((Image *)imageName_local)->depth;
    applyMask((Image *)imageName_local,this_00);
    destroy(this_00);
    if ((depth < 9) && (((Image *)imageName_local)->depth != depth)) {
      palettize((Image *)imageName_local,depth);
    }
  }
  return (Image *)imageName_local;
}

Assistant:

Image*
Image::readMasked(const char *imageName, const char *maskName)
{
	Image *img, *mask;

	img = read(imageName);
	if(img == nil)
		return nil;
	if(maskName && maskName[0]){
		mask = read(maskName);
		if(mask == nil)
			return img;
		mask->makeMask();
		int32 origDepth = img->depth;
		img->applyMask(mask);
		mask->destroy();
		if(origDepth <= 8 && img->depth != origDepth)
			img->palettize(origDepth);
	}
	return img;
}